

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToHalfPass::ProcessFunction(ConvertToHalfPass *this,Function *func)

{
  CFG *pCVar1;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *puVar2;
  pointer pBVar3;
  anon_class_16_2_3b81a10e local_b8;
  function<void_(spvtools::opt::BasicBlock_*)> local_a8;
  anon_class_16_2_3b81a10e local_88;
  function<void_(spvtools::opt::BasicBlock_*)> local_78;
  bool local_51;
  undefined1 auStack_50 [7];
  bool modified;
  ConvertToHalfPass *local_48;
  function<void_(spvtools::opt::BasicBlock_*)> local_40;
  bool local_19;
  Function *pFStack_18;
  bool changed;
  Function *func_local;
  ConvertToHalfPass *this_local;
  
  local_19 = true;
  pFStack_18 = func;
  func_local = (Function *)this;
  while ((local_19 & 1U) != 0) {
    local_19 = false;
    pCVar1 = Pass::cfg(&this->super_Pass);
    puVar2 = opt::Function::entry(pFStack_18);
    pBVar3 = std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::get(puVar2);
    _auStack_50 = &local_19;
    local_48 = this;
    std::function<void(spvtools::opt::BasicBlock*)>::
    function<spvtools::opt::ConvertToHalfPass::ProcessFunction(spvtools::opt::Function*)::__0,void>
              ((function<void(spvtools::opt::BasicBlock*)> *)&local_40,
               (anon_class_16_2_d485dd61 *)auStack_50);
    CFG::ForEachBlockInReversePostOrder(pCVar1,pBVar3,&local_40);
    std::function<void_(spvtools::opt::BasicBlock_*)>::~function(&local_40);
  }
  local_51 = false;
  pCVar1 = Pass::cfg(&this->super_Pass);
  puVar2 = opt::Function::entry(pFStack_18);
  pBVar3 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           get(puVar2);
  local_88.modified = &local_51;
  local_88.this = this;
  std::function<void(spvtools::opt::BasicBlock*)>::
  function<spvtools::opt::ConvertToHalfPass::ProcessFunction(spvtools::opt::Function*)::__1,void>
            ((function<void(spvtools::opt::BasicBlock*)> *)&local_78,&local_88);
  CFG::ForEachBlockInReversePostOrder(pCVar1,pBVar3,&local_78);
  std::function<void_(spvtools::opt::BasicBlock_*)>::~function(&local_78);
  pCVar1 = Pass::cfg(&this->super_Pass);
  puVar2 = opt::Function::entry(pFStack_18);
  pBVar3 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           get(puVar2);
  local_b8.modified = &local_51;
  local_b8.this = this;
  std::function<void(spvtools::opt::BasicBlock*)>::
  function<spvtools::opt::ConvertToHalfPass::ProcessFunction(spvtools::opt::Function*)::__2,void>
            ((function<void(spvtools::opt::BasicBlock*)> *)&local_a8,&local_b8);
  CFG::ForEachBlockInReversePostOrder(pCVar1,pBVar3,&local_a8);
  std::function<void_(spvtools::opt::BasicBlock_*)>::~function(&local_a8);
  return (bool)(local_51 & 1);
}

Assistant:

bool ConvertToHalfPass::ProcessFunction(Function* func) {
  // Do a closure of Relaxed on composite and phi instructions
  bool changed = true;
  while (changed) {
    changed = false;
    cfg()->ForEachBlockInReversePostOrder(
        func->entry().get(), [&changed, this](BasicBlock* bb) {
          for (auto ii = bb->begin(); ii != bb->end(); ++ii)
            changed |= CloseRelaxInst(&*ii);
        });
  }
  // Do convert of relaxed instructions to half precision
  bool modified = false;
  cfg()->ForEachBlockInReversePostOrder(
      func->entry().get(), [&modified, this](BasicBlock* bb) {
        for (auto ii = bb->begin(); ii != bb->end(); ++ii)
          modified |= GenHalfInst(&*ii);
      });
  // Replace invalid converts of matrix into equivalent vector extracts,
  // converts and finally a composite construct
  cfg()->ForEachBlockInReversePostOrder(
      func->entry().get(), [&modified, this](BasicBlock* bb) {
        for (auto ii = bb->begin(); ii != bb->end(); ++ii)
          modified |= MatConvertCleanup(&*ii);
      });
  return modified;
}